

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O2

bool __thiscall
DCanvas::SetTextureParms(DCanvas *this,DrawParms *parms,FTexture *img,double xx,double yy)

{
  double *y;
  undefined4 uVar1;
  ulong uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  int iVar8;
  double dVar9;
  undefined1 auVar10 [16];
  int iVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  if (img == (FTexture *)0x0) {
    return false;
  }
  parms->x = xx;
  parms->y = yy;
  uVar2._0_2_ = img->Width;
  uVar2._2_2_ = img->Height;
  uVar2._4_2_ = img->WidthMask;
  uVar2._6_2_ = *(undefined2 *)&img->field_0x3e;
  auVar5._8_4_ = 0;
  auVar5._0_8_ = uVar2;
  auVar5._12_2_ = uVar2._6_2_;
  auVar6._8_2_ = uVar2._4_2_;
  auVar6._0_8_ = uVar2;
  auVar6._10_4_ = auVar5._10_4_;
  auVar7._6_8_ = 0;
  auVar7._0_6_ = auVar6._8_6_;
  auVar10._0_8_ = (double)(ushort)(undefined2)uVar2;
  auVar10._8_8_ = (double)(int)CONCAT82(SUB148(auVar7 << 0x40,6),uVar2._2_2_);
  auVar10 = divpd(auVar10,(undefined1  [16])img->Scale);
  parms->texwidth = (double)auVar10._0_8_;
  parms->texheight = (double)auVar10._8_8_;
  if (((parms->top == 2147483647.0) && (!NAN(parms->top))) || (parms->fortext == true)) {
    iVar8 = FTexture::GetScaledTopOffset(img);
    parms->top = (double)iVar8;
  }
  if (((parms->left == 2147483647.0) && (!NAN(parms->left))) || (parms->fortext == true)) {
    iVar8 = FTexture::GetScaledLeftOffset(img);
    parms->left = (double)iVar8;
  }
  if (((parms->destwidth == 2147483647.0) && (!NAN(parms->destwidth))) || (parms->fortext == true))
  {
    parms->destwidth = (double)img->Width / (img->Scale).X;
  }
  if (((parms->destheight == 2147483647.0) && (!NAN(parms->destheight))) || (parms->fortext == true)
     ) {
    parms->destheight = (double)img->Height / (img->Scale).Y;
  }
  y = &parms->y;
  iVar8 = parms->cleanmode;
  if (iVar8 + 0xbfffec5aU < 2) {
    dVar14 = parms->x;
    dVar9 = parms->y;
    if (hud_scale.Value != true) {
      if (iVar8 == 0x400013a7) {
        dVar12 = (double)this->Width * 0.5;
LAB_00485d59:
        parms->x = dVar14 + dVar12;
      }
      else if (dVar14 < 0.0) {
        dVar12 = (double)this->Width;
        goto LAB_00485d59;
      }
      if (dVar9 < 0.0) {
        *y = dVar9 + (double)this->Height;
      }
      goto LAB_00485cf5;
    }
    dVar12 = (double)CleanXfac;
    parms->x = dVar14 * dVar12;
    if (iVar8 == 0x400013a7) {
      dVar13 = (double)this->Width * 0.5;
LAB_00485cb3:
      parms->x = dVar14 * dVar12 + dVar13;
    }
    else if (dVar14 < 0.0) {
      dVar13 = (double)this->Width;
      goto LAB_00485cb3;
    }
    dVar14 = (double)CleanYfac;
    *y = dVar9 * dVar14;
    if (dVar9 < 0.0) {
      *y = dVar9 * dVar14 + (double)this->Height;
    }
    dVar9 = parms->texwidth;
    dVar13 = parms->texheight;
  }
  else {
    if (iVar8 == 0x400013ae) {
      parms->x = 0.0;
      parms->y = 0.0;
      goto LAB_00485cf5;
    }
    if (iVar8 == 0x40001393) {
      dVar9 = parms->texwidth;
      dVar13 = parms->texheight;
      iVar8 = CleanXfac;
      iVar11 = CleanYfac;
    }
    else {
      if (iVar8 != 0x40001394) {
        if (iVar8 == 0x40001390) {
          dVar12 = (double)CleanXfac;
          dVar13 = (double)CleanYfac;
          uVar1 = this->Width;
          uVar3 = this->Height;
          dVar14 = (double)(int)uVar1 * 0.5 + (parms->x + -160.0) * dVar12;
          dVar9 = (double)(int)uVar3 * 0.5 + (parms->y + -100.0) * dVar13;
          auVar4._8_4_ = SUB84(dVar9,0);
          auVar4._0_8_ = dVar14;
          auVar4._12_4_ = (int)((ulong)dVar9 >> 0x20);
          parms->x = dVar14;
          parms->y = (double)auVar4._8_8_;
          parms->destwidth = parms->texwidth * dVar12;
          parms->destheight = parms->texheight * dVar13;
        }
        goto LAB_00485cf5;
      }
      dVar9 = parms->texwidth;
      dVar13 = parms->texheight;
      iVar8 = CleanXfac_1;
      iVar11 = CleanYfac_1;
    }
    dVar12 = (double)iVar8;
    dVar14 = (double)iVar11;
  }
  parms->destwidth = dVar12 * dVar9;
  parms->destheight = dVar14 * dVar13;
LAB_00485cf5:
  dVar14 = parms->virtWidth;
  dVar9 = parms->virtHeight;
  if ((dVar14 == (double)this->Width) && (!NAN(dVar14) && !NAN((double)this->Width))) {
    if ((dVar9 == (double)this->Height) && (!NAN(dVar9) && !NAN((double)this->Height))) {
      return false;
    }
  }
  VirtualToRealCoords(this,&parms->x,y,&parms->destwidth,&parms->destheight,dVar14,dVar9,
                      parms->virtBottom,parms->keepratio == 0);
  return false;
}

Assistant:

bool DCanvas::SetTextureParms(DrawParms *parms, FTexture *img, double xx, double yy) const
{
	if (img != NULL)
	{
		parms->x = xx;
		parms->y = yy;
		parms->texwidth = img->GetScaledWidthDouble();
		parms->texheight = img->GetScaledHeightDouble();
		if (parms->top == INT_MAX || parms->fortext)
		{
			parms->top = img->GetScaledTopOffset();
		}
		if (parms->left == INT_MAX || parms->fortext)
		{
			parms->left = img->GetScaledLeftOffset();
		}
		if (parms->destwidth == INT_MAX || parms->fortext)
		{
			parms->destwidth = img->GetScaledWidthDouble();
		}
		if (parms->destheight == INT_MAX || parms->fortext)
		{
			parms->destheight = img->GetScaledHeightDouble();
		}

		switch (parms->cleanmode)
		{
		default:
			break;

		case DTA_Clean:
			parms->x = (parms->x - 160.0) * CleanXfac + (Width * 0.5);
			parms->y = (parms->y - 100.0) * CleanYfac + (Height * 0.5);
			parms->destwidth = parms->texwidth * CleanXfac;
			parms->destheight = parms->texheight * CleanYfac;
			break;

		case DTA_CleanNoMove:
			parms->destwidth = parms->texwidth * CleanXfac;
			parms->destheight = parms->texheight * CleanYfac;
			break;

		case DTA_CleanNoMove_1:
			parms->destwidth = parms->texwidth * CleanXfac_1;
			parms->destheight = parms->texheight * CleanYfac_1;
			break;

		case DTA_Fullscreen:
			parms->x = parms->y = 0;
			break;

		case DTA_HUDRules:
		case DTA_HUDRulesC:
		{
			bool xright = parms->x < 0;
			bool ybot = parms->y < 0;

			if (hud_scale)
			{
				parms->x *= CleanXfac;
				if (parms->cleanmode == DTA_HUDRulesC)
					parms->x += Width * 0.5;
				else if (xright)
					parms->x = Width + parms->x;
				parms->y *= CleanYfac;
				if (ybot)
					parms->y = Height + parms->y;
				parms->destwidth = parms->texwidth * CleanXfac;
				parms->destheight = parms->texheight * CleanYfac;
			}
			else
			{
				if (parms->cleanmode == DTA_HUDRulesC)
					parms->x += Width * 0.5;
				else if (xright)
					parms->x = Width + parms->x;
				if (ybot)
					parms->y = Height + parms->y;
			}
			break;
		}
		}
		if (parms->virtWidth != Width || parms->virtHeight != Height)
		{
			VirtualToRealCoords(parms->x, parms->y, parms->destwidth, parms->destheight,
				parms->virtWidth, parms->virtHeight, parms->virtBottom, !parms->keepratio);
		}
	}

	return false;
}